

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O1

rb_result_t rb_tree_remove(rb_tree *tree,rb_tree_node *node)

{
  rb_tree_node **pprVar1;
  int iVar2;
  rb_tree_node *x;
  rb_tree_node *prVar3;
  rb_tree_node *prVar4;
  rb_tree_node *prVar5;
  rb_tree_node *prVar6;
  rb_tree_node *xp;
  rb_tree *prVar7;
  rb_tree_node *yright_2;
  rb_tree_node *prVar8;
  rb_tree_node *x_2;
  rb_tree_node *yleft_2;
  rb_tree_node *yleft;
  rb_tree_node *prVar9;
  long *in_FS_OFFSET;
  bool bVar10;
  
  if (tree == (rb_tree *)0x0) {
    rb_tree_remove_cold_2();
LAB_00115419:
    rb_tree_remove_cold_1();
    if (in_FS_OFFSET[-0x42] == 0) {
      in_FS_OFFSET[-0x42] = *in_FS_OFFSET + -0x200;
    }
    return (rb_result_t)in_FS_OFFSET[-0x42];
  }
  if (node == (rb_tree_node *)0x0) goto LAB_00115419;
  prVar5 = node->left;
  if ((prVar5 == (rb_tree_node *)0x0) || (prVar3 = node->right, node->right == (rb_tree_node *)0x0))
  {
    prVar6 = node;
    if (tree->rightmost == node) {
      prVar3 = node;
      if (prVar5 == (rb_tree_node *)0x0) {
        do {
          prVar4 = prVar3->parent;
          if (prVar4 == (rb_tree_node *)0x0) break;
          bVar10 = prVar3 == prVar4->left;
          prVar3 = prVar4;
        } while (bVar10);
      }
      else {
        do {
          prVar4 = prVar5;
          prVar5 = prVar4->right;
        } while (prVar4->right != (rb_tree_node *)0x0);
      }
      tree->rightmost = prVar4;
    }
  }
  else {
    do {
      prVar6 = prVar3;
      prVar3 = prVar6->left;
    } while (prVar6->left != (rb_tree_node *)0x0);
  }
  prVar5 = prVar6->left;
  if (prVar5 == (rb_tree_node *)0x0) {
    prVar5 = prVar6->right;
  }
  prVar3 = prVar6->parent;
  if (prVar5 != (rb_tree_node *)0x0) {
    prVar5->parent = prVar3;
  }
  prVar4 = prVar6->parent;
  if (prVar4 == (rb_tree_node *)0x0) {
    prVar3 = (rb_tree_node *)0x0;
    bVar10 = false;
    prVar7 = tree;
  }
  else {
    bVar10 = prVar6 == prVar4->left;
    prVar7 = (rb_tree *)(&prVar4->left + !bVar10);
  }
  prVar7->root = prVar5;
  iVar2 = prVar6->color;
  if (prVar6 == node) goto LAB_001150e8;
  prVar4 = node->left;
  prVar9 = node->right;
  prVar8 = node->parent;
  prVar6->parent = prVar8;
  if (prVar8 == (rb_tree_node *)0x0) {
    prVar7 = tree;
    if (tree->root == node) goto LAB_001150a1;
  }
  else {
    prVar7 = (rb_tree *)(&prVar8->left + (prVar8->left != node));
LAB_001150a1:
    prVar7->root = prVar6;
  }
  prVar6->right = prVar9;
  if (prVar9 != (rb_tree_node *)0x0) {
    prVar9->parent = prVar6;
  }
  node->right = (rb_tree_node *)0x0;
  prVar6->left = prVar4;
  if (prVar4 != (rb_tree_node *)0x0) {
    prVar4->parent = prVar6;
  }
  node->left = (rb_tree_node *)0x0;
  prVar6->color = node->color;
  node->parent = (rb_tree_node *)0x0;
  if (prVar3 == node) {
    prVar3 = prVar6;
  }
LAB_001150e8:
  if (iVar2 == 0) {
    prVar6 = tree->root;
    if (prVar6 != prVar5) {
      do {
        if ((prVar5 != (rb_tree_node *)0x0) && (prVar5->color != 0)) break;
        pprVar1 = &prVar3->right;
        prVar5 = (rb_tree_node *)pprVar1;
        if (!bVar10) {
          prVar5 = prVar3;
        }
        prVar4 = prVar5->left;
        if (prVar4 == (rb_tree_node *)0x0) {
          prVar4 = (rb_tree_node *)0x0;
        }
        else if (prVar4->color == 1) {
          prVar4->color = 0;
          prVar3->color = 1;
          if (bVar10) {
            prVar4 = *pprVar1;
            prVar9 = prVar4->left;
            *pprVar1 = prVar9;
            if (prVar9 != (rb_tree_node *)0x0) {
              prVar9->parent = prVar3;
            }
            prVar4->parent = prVar3->parent;
            prVar9 = prVar3->parent;
            prVar8 = prVar4;
            prVar7 = tree;
            if (prVar9 != (rb_tree_node *)0x0) {
              prVar7 = (rb_tree *)(&prVar9->left + (prVar9->left != prVar3));
              prVar8 = prVar6;
            }
            prVar7->root = prVar4;
            prVar4->left = prVar3;
            prVar6 = prVar8;
          }
          else {
            prVar4 = prVar3->left;
            prVar9 = prVar4->right;
            prVar3->left = prVar9;
            if (prVar9 != (rb_tree_node *)0x0) {
              prVar9->parent = prVar3;
            }
            prVar4->parent = prVar3->parent;
            prVar9 = prVar3->parent;
            prVar8 = prVar4;
            prVar7 = tree;
            if (prVar9 != (rb_tree_node *)0x0) {
              prVar7 = (rb_tree *)(&prVar9->left + (prVar9->left != prVar3));
              prVar8 = prVar6;
            }
            prVar7->root = prVar4;
            prVar4->right = prVar3;
            prVar6 = prVar8;
          }
          prVar3->parent = prVar4;
          prVar4 = prVar5->left;
        }
        if (prVar4 == (rb_tree_node *)0x0) {
          prVar5 = (rb_tree_node *)0x0;
          prVar9 = (rb_tree_node *)0x0;
        }
        else {
          prVar5 = prVar4->left;
          prVar9 = prVar4->right;
        }
        if (((prVar5 == (rb_tree_node *)0x0) || (prVar5->color == 0)) &&
           ((prVar9 == (rb_tree_node *)0x0 || (prVar9->color == 0)))) {
          if (prVar4 != (rb_tree_node *)0x0) {
            prVar4->color = 1;
          }
          prVar4 = prVar3->parent;
          bVar10 = false;
          prVar5 = prVar3;
          if (prVar4 != (rb_tree_node *)0x0) {
            bVar10 = prVar3 == prVar4->left;
          }
        }
        else {
          if (bVar10) {
            if ((prVar9 == (rb_tree_node *)0x0) || (prVar9->color == 0)) {
              prVar4->color = 1;
              if (prVar5 != (rb_tree_node *)0x0) {
                prVar5->color = 0;
              }
              prVar5 = prVar4->left;
              prVar9 = prVar5->right;
              prVar4->left = prVar9;
              if (prVar9 != (rb_tree_node *)0x0) {
                prVar9->parent = prVar4;
              }
              prVar5->parent = prVar4->parent;
              prVar9 = prVar4->parent;
              prVar8 = prVar5;
              prVar7 = tree;
              if (prVar9 != (rb_tree_node *)0x0) {
                prVar7 = (rb_tree *)(&prVar9->left + (prVar9->left != prVar4));
                prVar8 = prVar6;
              }
              prVar7->root = prVar5;
              prVar5->right = prVar4;
              prVar4->parent = prVar5;
              prVar5 = (rb_tree_node *)pprVar1;
              prVar6 = prVar8;
LAB_00115319:
              prVar4 = prVar5->left;
            }
          }
          else if ((prVar5 == (rb_tree_node *)0x0) || (prVar5->color == 0)) {
            prVar4->color = 1;
            if (prVar9 != (rb_tree_node *)0x0) {
              prVar9->color = 0;
            }
            prVar5 = prVar4->right;
            prVar9 = prVar5->left;
            prVar4->right = prVar9;
            if (prVar9 != (rb_tree_node *)0x0) {
              prVar9->parent = prVar4;
            }
            prVar5->parent = prVar4->parent;
            prVar9 = prVar4->parent;
            prVar8 = prVar5;
            prVar7 = tree;
            if (prVar9 != (rb_tree_node *)0x0) {
              prVar7 = (rb_tree *)(&prVar9->left + (prVar9->left != prVar4));
              prVar8 = prVar6;
            }
            prVar7->root = prVar5;
            prVar5->left = prVar4;
            prVar4->parent = prVar5;
            prVar5 = prVar3;
            prVar6 = prVar8;
            goto LAB_00115319;
          }
          prVar9 = prVar4->left;
          prVar5 = prVar4->right;
          prVar4->color = prVar3->color;
          prVar3->color = 0;
          prVar4 = prVar3;
          if ((bVar10) && (prVar5 != (rb_tree_node *)0x0)) {
            prVar5->color = 0;
            prVar5 = *pprVar1;
            prVar9 = prVar5->left;
            *pprVar1 = prVar9;
            if (prVar9 != (rb_tree_node *)0x0) {
              prVar9->parent = prVar3;
            }
            prVar5->parent = prVar3->parent;
            prVar9 = prVar3->parent;
            prVar8 = prVar5;
            prVar7 = tree;
            if (prVar9 != (rb_tree_node *)0x0) {
              prVar7 = (rb_tree *)(&prVar9->left + (prVar9->left != prVar3));
              prVar8 = prVar6;
            }
            prVar7->root = prVar5;
            prVar5->left = prVar3;
            prVar6 = prVar8;
          }
          else {
            prVar5 = prVar6;
            if ((bVar10) || (prVar9 == (rb_tree_node *)0x0)) goto LAB_001153e6;
            prVar9->color = 0;
            prVar5 = prVar3->left;
            prVar9 = prVar5->right;
            prVar3->left = prVar9;
            if (prVar9 != (rb_tree_node *)0x0) {
              prVar9->parent = prVar3;
            }
            prVar5->parent = prVar3->parent;
            prVar9 = prVar3->parent;
            prVar8 = prVar5;
            prVar7 = tree;
            if (prVar9 != (rb_tree_node *)0x0) {
              prVar7 = (rb_tree *)(&prVar9->left + (prVar9->left != prVar3));
              prVar8 = prVar6;
            }
            prVar7->root = prVar5;
            prVar5->right = prVar3;
            prVar6 = prVar8;
          }
          prVar3->parent = prVar5;
          prVar5 = prVar6;
        }
LAB_001153e6:
        prVar3 = prVar4;
      } while (prVar5 != prVar6);
    }
    if (prVar5 != (rb_tree_node *)0x0) {
      prVar5->color = 0;
    }
  }
  node->left = (rb_tree_node *)0x0;
  node->right = (rb_tree_node *)0x0;
  node->parent = (rb_tree_node *)0x0;
  return 0;
}

Assistant:

rb_result_t rb_tree_remove(struct rb_tree *tree,
                           struct rb_tree_node *node)
{
    rb_result_t ret = RB_OK;

    RB_ASSERT_ARG(tree != NULL);
    RB_ASSERT_ARG(node != NULL);

    struct rb_tree_node *y;


    if (node->left == NULL || node->right == NULL) {
        y = node;
        if (node == tree->rightmost) {
            /* The new rightmost item is our successor */
            tree->rightmost = __helper_rb_tree_find_predecessor(node);
        }
    } else {
        y = __helper_rb_tree_find_successor(node);
    }

    struct rb_tree_node *x, *xp;

    if (y->left != NULL) {
        x = y->left;
    } else {
        x = y->right;
    }

    if (x != NULL) {
        x->parent = y->parent;
        xp = x->parent;
    } else {
        xp = y->parent;
    }

    int is_left = 0;
    if (y->parent == NULL) {
        tree->root = x;
        xp = NULL;
    } else {
        struct rb_tree_node *yp = y->parent;
        if (y == yp->left) {
            yp->left = x;
            is_left = 1;
        } else {
            yp->right = x;
            is_left = 0;
        }
    }

    int y_color = y->color;

    /* Swap in the node */
    if (y != node) {
        __helper_rb_tree_swap_node(tree, node, y);
        if (xp == node) {
            xp = y;
        }
    }

    if (y_color == COLOR_BLACK) {
        __helper_rb_tree_delete_rebalance(tree, x, xp, is_left);
    }

    node->parent = NULL;
    node->left = NULL;
    node->right = NULL;

    return ret;
}